

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Call * __thiscall
wasm::Builder::makeCall
          (Builder *this,Name target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  Call *pCVar1;
  Call *call;
  bool isReturn_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_local;
  Builder *this_local;
  Type type_local;
  Name target_local;
  
  type_local.id = target.super_IString.str._M_len;
  pCVar1 = MixedArena::alloc<wasm::Call>(&this->wasm->allocator);
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = type.id;
  wasm::Name::operator=(&pCVar1->target,(Name *)&type_local);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar1->operands,
             args);
  pCVar1->isReturn = isReturn;
  return pCVar1;
}

Assistant:

Call* makeCall(Name target,
                 const std::vector<Expression*>& args,
                 Type type,
                 bool isReturn = false) {
    auto* call = wasm.allocator.alloc<Call>();
    // not all functions may exist yet, so type must be provided
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    return call;
  }